

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

_Bool rtsp_connisdead(connectdata *check)

{
  _Bool _Var1;
  uint uVar2;
  _Bool local_15;
  _Bool ret_val;
  int sval;
  connectdata *check_local;
  
  local_15 = true;
  uVar2 = Curl_socket_check(check->sock[0],-1,-1,0);
  if (uVar2 == 0) {
    local_15 = false;
  }
  else if ((uVar2 & 4) == 0) {
    if ((uVar2 & 1) != 0) {
      _Var1 = Curl_connalive(check);
      local_15 = (_Bool)((_Var1 ^ 0xffU) & 1);
    }
  }
  else {
    local_15 = true;
  }
  return local_15;
}

Assistant:

bool rtsp_connisdead(struct connectdata *check)
{
  int sval;
  bool ret_val = TRUE;

  sval = SOCKET_READABLE(check->sock[FIRSTSOCKET], 0);
  if(sval == 0) {
    /* timeout */
    ret_val = FALSE;
  }
  else if(sval & CURL_CSELECT_ERR) {
    /* socket is in an error state */
    ret_val = TRUE;
  }
  else if(sval & CURL_CSELECT_IN) {
    /* readable with no error. could still be closed */
    ret_val = !Curl_connalive(check);
  }

  return ret_val;
}